

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O2

void __thiscall
slang::FormatBuffer::format<int,std::basic_string_view<char,std::char_traits<char>>const>
          (FormatBuffer *this,format_string<int,_const_std::basic_string_view<char>_> fmt,int *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  format_args args_00;
  int local_28 [4];
  char *local_18;
  size_t local_10;
  
  local_28[0] = *args;
  local_10 = args_1->_M_len;
  local_18 = args_1->_M_str;
  args_00.field_1.values_ = (value<fmt::v11::context> *)local_28;
  args_00.desc_ = 0xd1;
  ::fmt::v11::detail::vformat_to((buffer<char> *)this,fmt.str,args_00,(locale_ref)0x0);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }